

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QPollingFileSystemWatcherEngine::FileInfo>::
emplace_helper<QPollingFileSystemWatcherEngine::FileInfo_const&>
          (QHash<QString,_QPollingFileSystemWatcherEngine::FileInfo> *this,QString *key,
          FileInfo *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<QString,_QPollingFileSystemWatcherEngine::FileInfo> *in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  FileInfo *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  Data<QHashPrivate::Node<QString,_QPollingFileSystemWatcherEngine::FileInfo>_>
  *in_stack_ffffffffffffffb8;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QString,_QPollingFileSystemWatcherEngine::FileInfo>_>::
  findOrInsert<QString>(in_stack_ffffffffffffffb8,in_RDI);
  QHashPrivate::iterator<QHashPrivate::Node<QString,_QPollingFileSystemWatcherEngine::FileInfo>_>::
  node((iterator<QHashPrivate::Node<QString,_QPollingFileSystemWatcherEngine::FileInfo>_> *)in_RDX);
  QHashPrivate::Node<QString,QPollingFileSystemWatcherEngine::FileInfo>::
  createInPlace<QPollingFileSystemWatcherEngine::FileInfo_const&>
            (in_RDX,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  it.bucket = (size_t)in_stack_ffffffffffffff98;
  it.d = (Data<QHashPrivate::Node<QString,_QPollingFileSystemWatcherEngine::FileInfo>_> *)
         in_stack_ffffffffffffff90;
  QHash<QString,_QPollingFileSystemWatcherEngine::FileInfo>::iterator::iterator
            (in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }